

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jas_image.c
# Opt level: O0

int jas_image_readcmpt(jas_image_t *image,uint cmptno,jas_image_coord_t x,jas_image_coord_t y,
                      jas_image_coord_t width,jas_image_coord_t height,jas_matrix_t *data)

{
  jas_image_cmpt_t *pjVar1;
  byte *pbVar2;
  int iVar3;
  jas_matind_t jVar4;
  size_t sVar5;
  long lVar6;
  jas_seqent_t jVar7;
  uint local_90;
  uint local_8c;
  uint local_88;
  jas_seqent_t *pjStack_80;
  int drs;
  jas_seqent_t *d;
  jas_seqent_t *dr;
  ulong uStack_68;
  int c;
  jas_seqent_t v;
  jas_image_coord_t jStack_58;
  int k;
  jas_image_coord_t j;
  jas_image_coord_t i;
  jas_image_cmpt_t *cmpt;
  jas_image_coord_t height_local;
  jas_image_coord_t width_local;
  jas_image_coord_t y_local;
  jas_image_coord_t x_local;
  uint cmptno_local;
  jas_image_t *image_local;
  
  iVar3 = jas_getdbglevel();
  if (99 < iVar3) {
    jas_eprintf("jas_image_readcmpt(%p, %d, %ld, %ld, %ld, %ld, %p)\n",image,(ulong)cmptno,x,y,width
                ,height,data);
  }
  if (data == (jas_matrix_t *)0x0) {
    image_local._4_4_ = -1;
  }
  else if (cmptno < image->numcmpts_) {
    pjVar1 = image->cmpts_[cmptno];
    if ((((x < pjVar1->width_) && (y < pjVar1->height_)) && (x + width <= pjVar1->width_)) &&
       (y + height <= pjVar1->height_)) {
      jVar4 = jas_matrix_numrows(data);
      if ((jVar4 == 0) || (jVar4 = jas_matrix_numcols(data), jVar4 == 0)) {
        image_local._4_4_ = -1;
      }
      else {
        jVar4 = jas_matrix_numrows(data);
        if (((jVar4 == height) && (jVar4 = jas_matrix_numcols(data), jVar4 == width)) ||
           (iVar3 = jas_matrix_resize(data,height,width), iVar3 == 0)) {
          d = jas_matrix_getref(data,0,0);
          sVar5 = jas_matrix_rowstep(data);
          for (j = 0; j < height; j = j + 1) {
            pjStack_80 = d;
            lVar6 = jas_stream_seek(pjVar1->stream_,
                                    (pjVar1->width_ * (y + j) + x) * (long)pjVar1->cps_,0);
            jStack_58 = width;
            if (lVar6 < 0) {
              return -1;
            }
            for (; 0 < jStack_58; jStack_58 = jStack_58 + -1) {
              uStack_68 = 0;
              for (v._4_4_ = pjVar1->cps_; 0 < v._4_4_; v._4_4_ = v._4_4_ + -1) {
                if ((pjVar1->stream_->flags_ & 7U) == 0) {
                  if ((pjVar1->stream_->rwlimit_ < 0) ||
                     (pjVar1->stream_->rwcnt_ < pjVar1->stream_->rwlimit_)) {
                    iVar3 = pjVar1->stream_->cnt_ + -1;
                    pjVar1->stream_->cnt_ = iVar3;
                    if (iVar3 < 0) {
                      local_8c = jas_stream_fillbuf(pjVar1->stream_,1);
                    }
                    else {
                      pjVar1->stream_->rwcnt_ = pjVar1->stream_->rwcnt_ + 1;
                      pbVar2 = pjVar1->stream_->ptr_;
                      pjVar1->stream_->ptr_ = pbVar2 + 1;
                      local_8c = (uint)*pbVar2;
                    }
                    local_88 = local_8c;
                  }
                  else {
                    pjVar1->stream_->flags_ = pjVar1->stream_->flags_ | 4;
                    local_88 = 0xffffffff;
                  }
                  local_90 = local_88;
                }
                else {
                  local_90 = 0xffffffff;
                }
                if (local_90 == 0xffffffff) {
                  return -1;
                }
                uStack_68 = uStack_68 << 8 | (long)(int)(local_90 & 0xff);
              }
              jVar7 = bitstoint(uStack_68,pjVar1->prec_,pjVar1->sgnd_ != 0);
              *pjStack_80 = jVar7;
              pjStack_80 = pjStack_80 + 1;
            }
            d = d + (int)sVar5;
          }
          image_local._4_4_ = 0;
        }
        else {
          image_local._4_4_ = -1;
        }
      }
    }
    else {
      image_local._4_4_ = -1;
    }
  }
  else {
    image_local._4_4_ = -1;
  }
  return image_local._4_4_;
}

Assistant:

int jas_image_readcmpt(jas_image_t *image, unsigned cmptno, jas_image_coord_t x,
  jas_image_coord_t y, jas_image_coord_t width, jas_image_coord_t height,
  jas_matrix_t *data)
{
	jas_image_cmpt_t *cmpt;
	jas_image_coord_t i;
	jas_image_coord_t j;
	int k;
	jas_seqent_t v;
	int c;
	jas_seqent_t *dr;
	jas_seqent_t *d;
	int drs;

	JAS_DBGLOG(100, ("jas_image_readcmpt(%p, %d, %ld, %ld, %ld, %ld, %p)\n",
	  image, cmptno, JAS_CAST(long, x), JAS_CAST(long, y),
	  JAS_CAST(long, width), JAS_CAST(long, height), data));

	if(data == NULL) {
		return -1;
	}

	if (cmptno >= image->numcmpts_) {
		return -1;
	}

	cmpt = image->cmpts_[cmptno];
	if (x >= cmpt->width_ || y >= cmpt->height_ ||
	  x + width > cmpt->width_ ||
	  y + height > cmpt->height_) {
		return -1;
	}

	if (!jas_matrix_numrows(data) || !jas_matrix_numcols(data)) {
		return -1;
	}

	if (jas_matrix_numrows(data) != height || jas_matrix_numcols(data) != width) {
		if (jas_matrix_resize(data, height, width)) {
			return -1;
		}
	}

	dr = jas_matrix_getref(data, 0, 0);
	drs = jas_matrix_rowstep(data);
	for (i = 0; i < height; ++i, dr += drs) {
		d = dr;
		if (jas_stream_seek(cmpt->stream_, (cmpt->width_ * (y + i) + x)
		  * cmpt->cps_, SEEK_SET) < 0) {
			return -1;
		}
		for (j = width; j > 0; --j, ++d) {
			v = 0;
			for (k = cmpt->cps_; k > 0; --k) {
				if ((c = jas_stream_getc(cmpt->stream_)) == EOF) {
					return -1;
				}
				v = (v << 8) | (c & 0xff);
			}
			*d = bitstoint(v, cmpt->prec_, cmpt->sgnd_);
		}
	}

	return 0;
}